

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_add_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  uint32_t val;
  long lVar1;
  uint8_t typecode;
  roaring_bulk_context_t context;
  uint8_t local_41;
  roaring_bulk_context_t local_40;
  
  if (n_args != 0) {
    val = *vals;
    local_40.container = containerptr_roaring_bitmap_add(r,val,&local_41,&local_40.idx);
    local_40.key = (uint16_t)(val >> 0x10);
    local_40.typecode = local_41;
    for (lVar1 = 0; n_args << 2 != lVar1; lVar1 = lVar1 + 4) {
      add_bulk_impl(r,&local_40,*(uint32_t *)((long)vals + lVar1));
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_many(roaring_bitmap_t *r, size_t n_args,
                             const uint32_t *vals) {
    uint32_t val;
    const uint32_t *start = vals;
    const uint32_t *end = vals + n_args;
    const uint32_t *current_val = start;

    if (n_args == 0) {
        return;
    }

    uint8_t typecode;
    int idx;
    container_t *container;
    val = *current_val;
    container = containerptr_roaring_bitmap_add(r, val, &typecode, &idx);
    roaring_bulk_context_t context = {container, idx, (uint16_t)(val >> 16),
                                      typecode};

    for (; current_val != end; current_val++) {
        memcpy(&val, current_val, sizeof(val));
        add_bulk_impl(r, &context, val);
    }
}